

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::HeapType> * __thiscall
wasm::Random::FeatureOptions<wasm::HeapType>::add
          (FeatureOptions<wasm::HeapType> *this,HeapType option)

{
  iterator __position;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_00;
  key_type local_1c;
  HeapType local_18;
  HeapType option_local;
  
  local_1c.features = 0;
  local_18.id = option.id;
  this_00 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            ::operator[](&this->options,&local_1c);
  __position._M_current = *(HeapType **)(this_00 + 8);
  if (__position._M_current == *(HeapType **)(this_00 + 0x10)) {
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_realloc_insert<wasm::HeapType_const&>(this_00,__position,&local_18);
  }
  else {
    (__position._M_current)->id = local_18.id;
    *(HeapType **)(this_00 + 8) = __position._M_current + 1;
  }
  return this;
}

Assistant:

FeatureOptions<T>& add(T option) {
      options[FeatureSet::MVP].push_back(option);
      return *this;
    }